

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampDepthCompareCase::init
          (TextureBorderClampDepthCompareCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  *this_00;
  float (*pafVar1) [2];
  deUint32 dVar2;
  pointer pIVar3;
  int iVar4;
  int ndx;
  long lVar5;
  long lVar6;
  undefined1 local_a8 [112];
  undefined8 local_38;
  
  TextureBorderClampTest::init(&this->super_TextureBorderClampTest,ctx);
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_a8);
  local_a8._0_4_ = -0.15;
  local_a8._4_4_ = -0.35;
  local_a8._8_4_ = 1.25;
  local_a8._12_4_ = 1.1;
  local_a8._16_8_ = 0x3f333333;
  local_a8._24_8_ = 0;
  std::__cxx11::string::assign((char *)(local_a8 + 0x48));
  local_38._0_4_ = 0x203;
  local_38._4_4_ = 0.5;
  this_00 = &this->m_iterations;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,(value_type *)local_a8);
  std::__cxx11::string::~string((string *)(local_a8 + 0x48));
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_a8);
  local_a8._0_4_ = -0.15;
  local_a8._4_4_ = -0.35;
  local_a8._8_4_ = 1.25;
  local_a8._12_4_ = 1.1;
  local_a8._16_8_ = 0x3fc00000;
  local_a8._24_8_ = 0;
  std::__cxx11::string::assign((char *)(local_a8 + 0x48));
  local_38._0_4_ = 0x203;
  local_38._4_4_ = 1.0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,(value_type *)local_a8);
  std::__cxx11::string::~string((string *)(local_a8 + 0x48));
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_a8);
  local_a8._0_4_ = -0.15;
  local_a8._4_4_ = -0.35;
  local_a8._8_4_ = 1.25;
  local_a8._12_4_ = 1.1;
  local_a8._16_8_ = 0xbf000000;
  local_a8._24_8_ = 0;
  std::__cxx11::string::assign((char *)(local_a8 + 0x48));
  local_38._0_4_ = 0x206;
  local_38._4_4_ = 0.0;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,(value_type *)local_a8);
  std::__cxx11::string::~string((string *)(local_a8 + 0x48));
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_a8);
  local_a8._0_4_ = -0.15;
  local_a8._4_4_ = -0.35;
  local_a8._8_4_ = 1.25;
  local_a8._12_4_ = 1.1;
  local_a8._16_8_ = 0x7f800000;
  local_a8._24_8_ = 0;
  std::__cxx11::string::assign((char *)(local_a8 + 0x48));
  local_38._0_4_ = 0x201;
  local_38._4_4_ = 1.25;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,(value_type *)local_a8);
  std::__cxx11::string::~string((string *)(local_a8 + 0x48));
  TextureBorderClampTest::IterationConfig::IterationConfig((IterationConfig *)local_a8);
  local_a8._0_4_ = -0.15;
  local_a8._4_4_ = -0.35;
  local_a8._8_4_ = 1.25;
  local_a8._12_4_ = 1.1;
  local_a8._16_8_ = 0xff800000;
  local_a8._24_8_ = 0;
  std::__cxx11::string::assign((char *)(local_a8 + 0x48));
  local_38._0_4_ = 0x204;
  local_38._4_4_ = -0.5;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
  ::push_back(this_00,(value_type *)local_a8);
  std::__cxx11::string::~string((string *)(local_a8 + 0x48));
  lVar6 = 0x6c;
  lVar5 = 0;
  while( true ) {
    pIVar3 = (this->m_iterations).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = (int)(((long)(this->m_iterations).
                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureBorderClampTest::IterationConfig>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) / 0x78);
    if (iVar4 <= lVar5) break;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_a8,1.0);
    pafVar1 = (float (*) [2])((long)(pIVar3->p0).m_data + lVar6 + -0x4c);
    *pafVar1 = (float  [2])local_a8._0_8_;
    pafVar1[1] = (float  [2])local_a8._8_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_a8,0.0);
    pafVar1 = (float (*) [2])((long)(pIVar3->p0).m_data + lVar6 + -0x3c);
    *pafVar1 = (float  [2])local_a8._0_8_;
    pafVar1[1] = (float  [2])local_a8._8_8_;
    dVar2 = this->m_filter;
    *(deUint32 *)((long)(pIVar3->p0).m_data + lVar6 + -0x2c) = dVar2;
    *(deUint32 *)((long)(&pIVar3->p0 + -5) + lVar6) = dVar2;
    *(undefined8 *)((long)(pIVar3->p0).m_data + lVar6 + -4) = 0x812d0000812d;
    lVar5 = lVar5 + 1;
    lVar6 = lVar6 + 0x78;
  }
  return iVar4;
}

Assistant:

void TextureBorderClampDepthCompareCase::init (void)
{
	TextureBorderClampTest::init();

	// 0.5 <= 0.7
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(0.7f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color in [0, 1] range";
		iteration.compareMode	= GL_LEQUAL;
		iteration.compareRef	= 0.5f;
		m_iterations.push_back(iteration);
	}

	// 1.5 <= 1.0
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(1.5f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color > 1, should be clamped";
		iteration.compareMode	= GL_LEQUAL;
		iteration.compareRef	= 1.0f;
		m_iterations.push_back(iteration);
	}

	// -0.5 >= 0.0
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-0.5f, 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color < 0, should be clamped";
		iteration.compareMode	= GL_GEQUAL;
		iteration.compareRef	= 0.0f;
		m_iterations.push_back(iteration);
	}

	// inf < 1.25
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(std::numeric_limits<float>::infinity(), 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color == inf, should be clamped; ref > 1";
		iteration.compareMode	= GL_LESS;
		iteration.compareRef	= 1.25f;
		m_iterations.push_back(iteration);
	}

	// -inf > -0.5
	{
		IterationConfig iteration;
		iteration.p0			= tcu::Vec2(-0.15f, -0.35f);
		iteration.p1			= tcu::Vec2( 1.25f,  1.1f);
		iteration.borderColor	= rr::GenericVec4(tcu::Vec4(-std::numeric_limits<float>::infinity(), 0.0f, 0.0f, 0.0f));
		iteration.description	= "Border color == inf, should be clamped; ref < 0";
		iteration.compareMode	= GL_GREATER;
		iteration.compareRef	= -0.5f;
		m_iterations.push_back(iteration);
	}

	// common parameters
	for (int ndx = 0; ndx < (int)m_iterations.size(); ++ndx)
	{
		IterationConfig& iteration = m_iterations[ndx];

		iteration.lookupScale	= tcu::Vec4(1.0);
		iteration.lookupBias	= tcu::Vec4(0.0);
		iteration.minFilter		= m_filter;
		iteration.magFilter		= m_filter;
		iteration.sWrapMode		= GL_CLAMP_TO_BORDER;
		iteration.tWrapMode		= GL_CLAMP_TO_BORDER;
	}
}